

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O2

void __thiscall TasgridWrapper::outputPoints(TasgridWrapper *this,output_points_mode mode)

{
  int rows;
  vector<double,_std::allocator<double>_> points;
  _Vector_base<double,_std::allocator<double>_> local_30;
  
  if (((this->outfilename)._M_string_length != 0) || (this->printCout == true)) {
    if (mode == needed) {
      if (*(long *)&this->field_0x8 == 0) {
        rows = 0;
      }
      else {
        rows = *(int *)(*(long *)&this->field_0x8 + 0x48);
      }
      TasGrid::TasmanianSparseGrid::getNeededPoints
                ((vector<double,_std::allocator<double>_> *)&local_30,&this->grid);
    }
    else {
      rows = TasGrid::TasmanianSparseGrid::getNumPoints(&this->grid);
      TasGrid::TasmanianSparseGrid::getPoints
                ((vector<double,_std::allocator<double>_> *)&local_30,&this->grid);
    }
    writeMatrix(this,&this->outfilename,rows,this->num_dimensions,
                local_30._M_impl.super__Vector_impl_data._M_start);
    printMatrix(this,rows,this->num_dimensions,local_30._M_impl.super__Vector_impl_data._M_start,
                false);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_30);
  }
  return;
}

Assistant:

void TasgridWrapper::outputPoints(output_points_mode mode) const{
    if (outfilename.empty() and not printCout) return;
    int num_points = (mode == output_points_mode::needed) ? grid.getNumNeeded() : grid.getNumPoints();
    auto points = (mode == output_points_mode::needed) ? grid.getNeededPoints() : grid.getPoints();
    writeMatrix(outfilename, num_points, num_dimensions, points.data());
    printMatrix(num_points, num_dimensions, points.data());
}